

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_empower(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *txt;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  CHAR_DATA *victim;
  char buf [4608];
  char arg2 [4608];
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffc9c8;
  char *in_stack_ffffffffffffc9d0;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffc9d8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffc9e0;
  char local_3618 [8];
  char *in_stack_ffffffffffffc9f0;
  char *in_stack_ffffffffffffc9f8;
  char local_2418;
  int in_stack_ffffffffffffdc1c;
  long in_stack_ffffffffffffdc20;
  long in_stack_ffffffffffffdc28;
  OBJ_DATA *in_stack_ffffffffffffdc30;
  CHAR_DATA *in_stack_ffffffffffffdc38;
  char *in_stack_ffffffffffffdc40;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  
  one_argument(in_stack_ffffffffffffc9d0,(char *)in_stack_ffffffffffffc9c8);
  one_argument(in_stack_ffffffffffffc9d0,(char *)in_stack_ffffffffffffc9c8);
  if ((in_stack_ffffffffffffede8 == '\0') || (local_2418 == '\0')) {
    send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
  }
  else {
    bVar1 = is_switched(in_RDI);
    if (bVar1) {
      send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
    }
    else {
      txt = get_char_world(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
      if ((txt != (CHAR_DATA *)0x0) && (bVar1 = is_npc(in_stack_ffffffffffffc9c8), !bVar1)) {
        bVar1 = str_prefix(in_stack_ffffffffffffc9f8,in_stack_ffffffffffffc9f0);
        if (!bVar1) {
          ch_00 = (CHAR_DATA *)txt->act[0];
          _Var2 = std::pow<int,int>(0,0x59b967);
          if (((ulong)ch_00 & (long)_Var2) != 0) {
            _Var2 = std::pow<int,int>(0,0x59b98d);
            txt->act[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & txt->act[0];
            send_to_char((char *)txt,ch_00);
            act((char *)txt,ch_00,in_stack_ffffffffffffc9d0,in_stack_ffffffffffffc9c8,0);
            sprintf(local_3618,"$N revokes %s\'s empowerment.",txt->name);
            wiznet(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30,
                   in_stack_ffffffffffffdc28,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1c);
            sprintf(local_3618,"AUTO: Unempowered by %s.\n\r",in_RDI->true_name);
            add_history(in_stack_ffffffffffffedf0,
                        (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                        in_stack_ffffffffffffede0);
            return;
          }
          send_to_char((char *)txt,ch_00);
          return;
        }
        bVar1 = str_prefix(in_stack_ffffffffffffc9f8,in_stack_ffffffffffffc9f0);
        if (bVar1) {
          send_to_char((char *)txt,in_stack_ffffffffffffc9d8);
          return;
        }
        arg1 = (void *)txt->act[0];
        _Var2 = std::pow<int,int>(0,0x59baad);
        if (((ulong)arg1 & (long)_Var2) == 0) {
          _Var2 = std::pow<int,int>(0,0x59bad3);
          txt->act[0] = (long)_Var2 | txt->act[0];
          act((char *)txt,in_stack_ffffffffffffc9d8,arg1,in_stack_ffffffffffffc9c8,0);
          sprintf(local_3618,"$N empowers %s.",txt->name);
          wiznet(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30,
                 in_stack_ffffffffffffdc28,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1c);
          sprintf(local_3618,"AUTO: Empowered by %s.\n\r",in_RDI->true_name);
          add_history(in_stack_ffffffffffffedf0,
                      (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                      in_stack_ffffffffffffede0);
          return;
        }
        send_to_char((char *)txt,in_stack_ffffffffffffc9d8);
        return;
      }
      send_to_char((char *)txt,in_stack_ffffffffffffc9d8);
    }
  }
  return;
}

Assistant:

void do_empower(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_STRING_LENGTH];
	char arg2[MAX_STRING_LENGTH];
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg);
	argument = one_argument(argument, arg2);

	if (arg[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax: empower <char> <yes/no>\n\r", ch);
		return;
	}

	if (is_switched(ch))
	{
		send_to_char("You can't do that while switched!\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr || is_npc(victim))
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "no"))
	{
		if (IS_SET(victim->act, PLR_EMPOWERED))
		{
			REMOVE_BIT(victim->act, PLR_EMPOWERED);

			send_to_char("The Immortals have revoked your empowerment!\n\r", victim);
			act("You have UNEMPOWERED $N, until you notify $M, $E doesn't know.", ch, 0, victim, TO_CHAR);

			sprintf(buf, "$N revokes %s's empowerment.", victim->name);
			wiznet(buf, ch, nullptr, WIZ_PENALTIES, 0, 0);

			sprintf(buf, "AUTO: Unempowered by %s.\n\r", ch->true_name);
			add_history(nullptr, victim, buf);

			return;
		}
		else
		{
			send_to_char("They are not empowered in the first place.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg2, "yes"))
	{
		if (!IS_SET(victim->act, PLR_EMPOWERED))
		{
			SET_BIT(victim->act, PLR_EMPOWERED);

			act("You have EMPOWERED $N, until you notify $M, $E doesn't know.", ch, 0, victim, TO_CHAR);

			sprintf(buf, "$N empowers %s.", victim->name);
			wiznet(buf, ch, nullptr, WIZ_PENALTIES, 0, 0);

			sprintf(buf, "AUTO: Empowered by %s.\n\r", ch->true_name);
			add_history(nullptr, victim, buf);

			return;
		}
		else
		{
			send_to_char("They are already empowered.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("Syntax: empower <char> <yes/no>\n\r", ch);
		return;
	}
}